

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O2

void cf2_glyphpath_pushMove(CF2_GlyphPath glyphpath,FT_Vector start)

{
  CF2_CallbackParamsRec params;
  CF2_CallbackParamsRec_ local_78;
  
  local_78.op = 1;
  local_78.pt0.x = (glyphpath->currentDS).x;
  local_78.pt0.y = (glyphpath->currentDS).y;
  if ((glyphpath->hintMap).isValid == '\0') {
    cf2_glyphpath_moveTo
              (glyphpath,(CF2_F16Dot16)(glyphpath->start).x,(CF2_F16Dot16)(glyphpath->start).y);
  }
  cf2_glyphpath_hintPoint
            (glyphpath,&glyphpath->hintMap,&local_78.pt1,(CF2_F16Dot16)start.x,(CF2_F16Dot16)start.y
            );
  (*glyphpath->callbacks->moveTo)(glyphpath->callbacks,&local_78);
  (glyphpath->currentDS).x = local_78.pt1.x;
  (glyphpath->currentDS).y = local_78.pt1.y;
  (glyphpath->offsetStart0).x = start.x;
  (glyphpath->offsetStart0).y = start.y;
  return;
}

Assistant:

static void
  cf2_glyphpath_pushMove( CF2_GlyphPath  glyphpath,
                          FT_Vector      start )
  {
    CF2_CallbackParamsRec  params;


    params.op  = CF2_PathOpMoveTo;
    params.pt0 = glyphpath->currentDS;

    /* Test if move has really happened yet; it would have called */
    /* `cf2_hintmap_build' to set `isValid'.                   */
    if ( !cf2_hintmap_isValid( &glyphpath->hintMap ) )
    {
      /* we are here iff first subpath is missing a moveto operator: */
      /* synthesize first moveTo to finish initialization of hintMap */
      cf2_glyphpath_moveTo( glyphpath,
                            glyphpath->start.x,
                            glyphpath->start.y );
    }

    cf2_glyphpath_hintPoint( glyphpath,
                             &glyphpath->hintMap,
                             &params.pt1,
                             start.x,
                             start.y );

    /* note: pt2 and pt3 are unused */
    glyphpath->callbacks->moveTo( glyphpath->callbacks, &params );

    glyphpath->currentDS    = params.pt1;
    glyphpath->offsetStart0 = start;
  }